

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

bool wasm::BranchUtils::replacePossibleTarget(Expression *branch,Name from,Name to)

{
  anon_class_24_3_17062666 func;
  bool local_31;
  Expression *pEStack_30;
  bool worked;
  Expression *branch_local;
  Name to_local;
  Name from_local;
  
  to_local.super_IString.str._M_len = to.super_IString.str._M_str;
  branch_local = to.super_IString.str._M_len;
  to_local.super_IString.str._M_str = from.super_IString.str._M_len;
  local_31 = false;
  func.to = (Name *)&branch_local;
  func.from = (Name *)&to_local.super_IString.str._M_str;
  func.worked = &local_31;
  pEStack_30 = branch;
  operateOnScopeNameUses<wasm::BranchUtils::replacePossibleTarget(wasm::Expression*,wasm::Name,wasm::Name)::_lambda(wasm::Name&)_1_>
            (branch,func);
  return (bool)(local_31 & 1);
}

Assistant:

inline bool replacePossibleTarget(Expression* branch, Name from, Name to) {
  bool worked = false;
  operateOnScopeNameUses(branch, [&](Name& name) {
    if (name == from) {
      name = to;
      worked = true;
    }
  });
  return worked;
}